

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,qsizetype n)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Command *pCVar4;
  long lVar5;
  Command *end;
  Command *pCVar6;
  Command *__last;
  
  __last = b + n;
  pCVar4 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
  lVar5 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
  pCVar6 = pCVar4 + lVar5;
  if (__last == pCVar6 || pCVar4 != b) {
    if (__last != pCVar6) {
      do {
        pDVar1 = (b->cmd).name.d.d;
        pCVar4 = b + n;
        (b->cmd).name.d.d = (pCVar4->cmd).name.d.d;
        (pCVar4->cmd).name.d.d = pDVar1;
        pcVar2 = (b->cmd).name.d.ptr;
        (b->cmd).name.d.ptr = (pCVar4->cmd).name.d.ptr;
        (pCVar4->cmd).name.d.ptr = pcVar2;
        qVar3 = (b->cmd).name.d.size;
        (b->cmd).name.d.size = (pCVar4->cmd).name.d.size;
        (pCVar4->cmd).name.d.size = qVar3;
        pDVar1 = (b->cmd).type.d.d;
        (b->cmd).type.d.d = (pCVar4->cmd).type.d.d;
        (pCVar4->cmd).type.d.d = pDVar1;
        pcVar2 = (b->cmd).type.d.ptr;
        (b->cmd).type.d.ptr = (pCVar4->cmd).type.d.ptr;
        (pCVar4->cmd).type.d.ptr = pcVar2;
        qVar3 = (b->cmd).type.d.size;
        (b->cmd).type.d.size = (pCVar4->cmd).type.d.size;
        (pCVar4->cmd).type.d.size = qVar3;
        pDVar1 = (b->cmd).typeSuffix.d.d;
        (b->cmd).typeSuffix.d.d = (pCVar4->cmd).typeSuffix.d.d;
        (pCVar4->cmd).typeSuffix.d.d = pDVar1;
        pcVar2 = (b->cmd).typeSuffix.d.ptr;
        (b->cmd).typeSuffix.d.ptr = (pCVar4->cmd).typeSuffix.d.ptr;
        (pCVar4->cmd).typeSuffix.d.ptr = pcVar2;
        qVar3 = (b->cmd).typeSuffix.d.size;
        (b->cmd).typeSuffix.d.size = (pCVar4->cmd).typeSuffix.d.size;
        (pCVar4->cmd).typeSuffix.d.size = qVar3;
        QArrayDataPointer<VkSpecParser::TypedName>::operator=(&(b->args).d,&(pCVar4->args).d);
        b->deviceLevel = pCVar4->deviceLevel;
        pCVar4 = b + n + 1;
        b = b + 1;
      } while (pCVar4 != pCVar6);
      lVar5 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      __last = b + n;
    }
  }
  else {
    (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr = __last;
  }
  (this->super_QArrayDataPointer<VkSpecParser::Command>).size = lVar5 - n;
  std::_Destroy_aux<false>::__destroy<VkSpecParser::Command*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }